

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

int INT_REVaction_add_split_target
              (CMConnection conn,EVstone stone,EVaction action,EVstone target_stone)

{
  int iVar1;
  CManager cm;
  undefined4 in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  CManager in_RDI;
  EVaction_add_split_target_request request;
  EV_int_response response;
  CMFormat f;
  int cond;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  CManager in_stack_ffffffffffffffe0;
  int condition;
  
  memset(&stack0xffffffffffffffc8,0,0x10);
  iVar1 = INT_CMCondition_get(in_stack_ffffffffffffffe0,
                              (CMConnection)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  cm = (CManager)
       INT_CMlookup_format((CManager)in_RDI->transports,EVaction_add_split_target_req_formats);
  condition = in_ESI;
  if (cm == (CManager)0x0) {
    cm = (CManager)
         INT_CMregister_format
                   ((CManager)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (FMStructDescList)CONCAT44(in_ECX,in_EDX));
  }
  INT_CMCondition_set_client_data(cm,in_stack_ffffffffffffffdc,(void *)CONCAT44(in_ECX,in_EDX));
  INT_CMwrite((CMConnection)CONCAT44(in_ECX,in_EDX),(CMFormat)CONCAT44(in_ESI,iVar1),
              (void *)0x15430b);
  INT_CMCondition_wait(in_RDI,condition);
  return in_stack_ffffffffffffffdc;
}

Assistant:

extern int
INT_REVaction_add_split_target(CMConnection conn, EVstone stone, EVaction action, EVstone target_stone)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVaction_add_split_target_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVaction_add_split_target_req_formats);
    request.stone = stone;
    request.action = action;
    request.target_stone = target_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVaction_add_split_target_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return response.ret;
}